

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint8 *
ma_dr_wav__metadata_get_memory(ma_dr_wav__metadata_parser *pParser,size_t size,size_t align)

{
  ma_uint8 *pmVar1;
  ulong uVar2;
  ma_uintptr modulo;
  ma_uint8 *pResult;
  size_t align_local;
  size_t size_local;
  ma_dr_wav__metadata_parser *pParser_local;
  
  if ((align != 0) && (uVar2 = (ulong)pParser->pDataCursor % align, uVar2 != 0)) {
    pParser->pDataCursor = pParser->pDataCursor + (align - uVar2);
  }
  pmVar1 = pParser->pDataCursor;
  pParser->pDataCursor = pParser->pDataCursor + size;
  return pmVar1;
}

Assistant:

MA_PRIVATE ma_uint8* ma_dr_wav__metadata_get_memory(ma_dr_wav__metadata_parser* pParser, size_t size, size_t align)
{
    ma_uint8* pResult;
    if (align) {
        ma_uintptr modulo = (ma_uintptr)pParser->pDataCursor % align;
        if (modulo != 0) {
            pParser->pDataCursor += align - modulo;
        }
    }
    pResult = pParser->pDataCursor;
    MA_DR_WAV_ASSERT((pResult + size) <= (pParser->pData + ma_dr_wav__metadata_memory_capacity(pParser)));
    pParser->pDataCursor += size;
    return pResult;
}